

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O2

void __thiscall duckdb::DataChunk::Hash(DataChunk *this,Vector *result)

{
  reference pvVar1;
  idx_t i;
  ulong __n;
  
  pvVar1 = vector<duckdb::Vector,_true>::get<true>(&this->data,0);
  VectorOperations::Hash(pvVar1,result,this->count);
  for (__n = 1; __n < (ulong)(((long)(this->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    pvVar1 = vector<duckdb::Vector,_true>::get<true>(&this->data,__n);
    VectorOperations::CombineHash(result,pvVar1,this->count);
  }
  return;
}

Assistant:

void DataChunk::Hash(Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalType::HASH);
	VectorOperations::Hash(data[0], result, size());
	for (idx_t i = 1; i < ColumnCount(); i++) {
		VectorOperations::CombineHash(result, data[i], size());
	}
}